

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

bool __thiscall S2Polygon::Intersects(S2Polygon *this,S2Polygon *b)

{
  bool bVar1;
  pointer *__ptr;
  Options local_48;
  
  bVar1 = S2LatLngRect::Intersects(&this->bound_,&b->bound_);
  if (bVar1) {
    bVar1 = is_full(this);
    if ((bVar1) && (bVar1 = is_full(b), bVar1)) {
      return true;
    }
    S2BooleanOperation::Options::Options(&local_48);
    bVar1 = S2BooleanOperation::Intersects
                      (&(this->index_).super_S2ShapeIndex,&(b->index_).super_S2ShapeIndex,&local_48)
    ;
    if (local_48.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)0x0
       ) {
      (*(*(_func_int ***)
          local_48.snap_function_._M_t.
          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool S2Polygon::Intersects(const S2Polygon* b) const {
  // It's worth checking bounding rectangles, since they are precomputed.
  if (!bound_.Intersects(b->bound_)) return false;

  // The following case is not handled by S2BooleanOperation because it only
  // determines whether the boundary of the result is empty (which does not
  // distinguish between the full and empty polygons).
  if (is_full() && b->is_full()) return true;

  return S2BooleanOperation::Intersects(index_, b->index_);
}